

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_reconfig(Terminal *term,Conf *conf)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  _Bool _Var8;
  _Bool _Var9;
  _Bool _Var10;
  _Bool _Var11;
  _Bool _Var12;
  int iVar13;
  int iVar14;
  char *pcVar15;
  char *__s2;
  Conf *pCVar16;
  int local_40;
  int local_3c;
  wchar_t j;
  wchar_t i_1;
  char *new_title;
  char *old_title;
  wchar_t i;
  _Bool palette_changed;
  _Bool reset_charclass;
  _Bool reset_tblink;
  _Bool reset_bce;
  _Bool reset_decom;
  _Bool reset_wrap;
  Conf *conf_local;
  Terminal *term_local;
  
  bVar2 = false;
  _Var3 = conf_get_bool(term->conf,0x6c);
  _Var4 = conf_get_bool(conf,0x6c);
  _Var5 = conf_get_bool(term->conf,0x6b);
  _Var6 = conf_get_bool(conf,0x6b);
  _Var7 = conf_get_bool(term->conf,0x7a);
  _Var8 = conf_get_bool(conf,0x7a);
  _Var9 = conf_get_bool(term->conf,0x7b);
  _Var10 = conf_get_bool(conf,0x7b);
  bVar1 = false;
  for (old_title._4_4_ = 0; old_title._4_4_ < 0x100; old_title._4_4_ = old_title._4_4_ + 1) {
    iVar13 = conf_get_int_int(term->conf,0x9d,old_title._4_4_);
    iVar14 = conf_get_int_int(conf,0x9d,old_title._4_4_);
    if (iVar13 != iVar14) {
      bVar1 = true;
    }
  }
  _Var11 = conf_get_bool(term->conf,0x8d);
  _Var12 = conf_get_bool(conf,0x8d);
  if (_Var11 == _Var12) {
    _Var11 = conf_get_bool(term->conf,0x8e);
    _Var12 = conf_get_bool(conf,0x8e);
    if (_Var11 == _Var12) goto LAB_0010a9a4;
  }
  for (old_title._4_4_ = 0; (ulong)(long)old_title._4_4_ < term->bidi_cache_size;
      old_title._4_4_ = old_title._4_4_ + 1) {
    safefree(term->pre_bidi_cache[old_title._4_4_].chars);
    safefree(term->post_bidi_cache[old_title._4_4_].chars);
    term->pre_bidi_cache[old_title._4_4_].width = L'\xffffffff';
    term->pre_bidi_cache[old_title._4_4_].chars = (termchar *)0x0;
    term->post_bidi_cache[old_title._4_4_].width = L'\xffffffff';
    term->post_bidi_cache[old_title._4_4_].chars = (termchar *)0x0;
  }
LAB_0010a9a4:
  pcVar15 = conf_get_str(term->conf,0x69);
  __s2 = conf_get_str(conf,0x69);
  iVar13 = strcmp(pcVar15,__s2);
  if (iVar13 != 0) {
    safefree(term->window_title);
    pcVar15 = dupstr(__s2);
    term->window_title = pcVar15;
    term->wintitle_codepage = L'\xffff';
    term->win_title_pending = true;
    term_schedule_update(term);
  }
  local_3c = 0;
  do {
    if (0x15 < local_3c) {
LAB_0010aaa9:
      conf_free(term->conf);
      pCVar16 = conf_copy(conf);
      term->conf = pCVar16;
      if (_Var3 != _Var4) {
        _Var3 = conf_get_bool(term->conf,0x6c);
        term->wrap = _Var3;
        term->alt_wrap = _Var3;
      }
      if (_Var5 != _Var6) {
        _Var3 = conf_get_bool(term->conf,0x6b);
        term->dec_om = _Var3;
        term->alt_om = _Var3;
      }
      if (_Var7 != _Var8) {
        _Var3 = conf_get_bool(term->conf,0x7a);
        term->use_bce = _Var3;
        set_erase_char(term);
      }
      if (_Var9 != _Var10) {
        _Var3 = conf_get_bool(term->conf,0x7b);
        term->blink_is_real = _Var3;
      }
      if (bVar1) {
        for (old_title._4_4_ = 0; old_title._4_4_ < 0x100; old_title._4_4_ = old_title._4_4_ + 1) {
          iVar13 = conf_get_int_int(term->conf,0x9d,old_title._4_4_);
          term->wordness[old_title._4_4_] = (short)iVar13;
        }
      }
      _Var3 = conf_get_bool(term->conf,0x50);
      if (_Var3) {
        swap_screen(term,L'\0',false,false);
      }
      _Var3 = conf_get_bool(term->conf,0x54);
      if (_Var3) {
        term->cset_attr[1] = L'\xd800';
        term->cset_attr[0] = L'\xd800';
        term->alt_sco_acs = L'\0';
        term->sco_acs = L'\0';
        term->utf = false;
      }
      pcVar15 = conf_get_str(term->conf,0x8c);
      if (pcVar15 == (char *)0x0) {
        term_print_finish(term);
      }
      if (bVar2) {
        term_notify_palette_changed(term);
      }
      term_schedule_tblink(term);
      term_schedule_cblink(term);
      term_copy_stuff_from_conf(term);
      term_update_raw_mouse_mode(term);
      return;
    }
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      iVar13 = conf_get_int_int(term->conf,0x95,local_3c * 3 + local_40);
      iVar14 = conf_get_int_int(conf,0x95,local_3c * 3 + local_40);
      if (iVar13 != iVar14) break;
    }
    if (local_40 < 3) {
      bVar2 = true;
      goto LAB_0010aaa9;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void term_reconfig(Terminal *term, Conf *conf)
{
    /*
     * Before adopting the new config, check all those terminal
     * settings which control power-on defaults; and if they've
     * changed, we will modify the current state as well as the
     * default one. The full list is: Auto wrap mode, DEC Origin
     * Mode, BCE, blinking text, character classes.
     */
    bool reset_wrap, reset_decom, reset_bce, reset_tblink, reset_charclass;
    bool palette_changed = false;
    int i;

    reset_wrap = (conf_get_bool(term->conf, CONF_wrap_mode) !=
                  conf_get_bool(conf, CONF_wrap_mode));
    reset_decom = (conf_get_bool(term->conf, CONF_dec_om) !=
                   conf_get_bool(conf, CONF_dec_om));
    reset_bce = (conf_get_bool(term->conf, CONF_bce) !=
                 conf_get_bool(conf, CONF_bce));
    reset_tblink = (conf_get_bool(term->conf, CONF_blinktext) !=
                    conf_get_bool(conf, CONF_blinktext));
    reset_charclass = false;
    for (i = 0; i < 256; i++)
        if (conf_get_int_int(term->conf, CONF_wordness, i) !=
            conf_get_int_int(conf, CONF_wordness, i))
            reset_charclass = true;

    /*
     * If the bidi or shaping settings have changed, flush the bidi
     * cache completely.
     */
    if (conf_get_bool(term->conf, CONF_no_arabicshaping) !=
        conf_get_bool(conf, CONF_no_arabicshaping) ||
        conf_get_bool(term->conf, CONF_no_bidi) !=
        conf_get_bool(conf, CONF_no_bidi)) {
        for (i = 0; i < term->bidi_cache_size; i++) {
            sfree(term->pre_bidi_cache[i].chars);
            sfree(term->post_bidi_cache[i].chars);
            term->pre_bidi_cache[i].width = -1;
            term->pre_bidi_cache[i].chars = NULL;
            term->post_bidi_cache[i].width = -1;
            term->post_bidi_cache[i].chars = NULL;
        }
    }

    {
        const char *old_title = conf_get_str(term->conf, CONF_wintitle);
        const char *new_title = conf_get_str(conf, CONF_wintitle);
        if (strcmp(old_title, new_title)) {
            sfree(term->window_title);
            term->window_title = dupstr(new_title);
            term->wintitle_codepage = DEFAULT_CODEPAGE;
            term->win_title_pending = true;
            term_schedule_update(term);
        }
    }

    /*
     * Just setting conf is sufficient to cause colour setting changes
     * to appear on the next ESC]R palette reset. But we should also
     * check whether any colour settings have been changed, so that
     * they can be updated immediately if they haven't been overridden
     * by some escape sequence.
     */
    {
        int i, j;
        for (i = 0; i < CONF_NCOLOURS; i++) {
            for (j = 0; j < 3; j++)
                if (conf_get_int_int(term->conf, CONF_colours, i*3+j) !=
                    conf_get_int_int(conf, CONF_colours, i*3+j))
                    break;
            if (j < 3) {
                /* Actually enacting the change has to be deferred 
                 * until the new conf is installed. */
                palette_changed = true;
                break;
            }
        }
    }

    conf_free(term->conf);
    term->conf = conf_copy(conf);

    if (reset_wrap)
        term->alt_wrap = term->wrap = conf_get_bool(term->conf, CONF_wrap_mode);
    if (reset_decom)
        term->alt_om = term->dec_om = conf_get_bool(term->conf, CONF_dec_om);
    if (reset_bce) {
        term->use_bce = conf_get_bool(term->conf, CONF_bce);
        set_erase_char(term);
    }
    if (reset_tblink) {
        term->blink_is_real = conf_get_bool(term->conf, CONF_blinktext);
    }
    if (reset_charclass)
        for (i = 0; i < 256; i++)
            term->wordness[i] = conf_get_int_int(term->conf, CONF_wordness, i);

    if (conf_get_bool(term->conf, CONF_no_alt_screen))
        swap_screen(term, 0, false, false);
    if (conf_get_bool(term->conf, CONF_no_remote_charset)) {
        term->cset_attr[0] = term->cset_attr[1] = CSET_ASCII;
        term->sco_acs = term->alt_sco_acs = 0;
        term->utf = false;
    }
    if (!conf_get_str(term->conf, CONF_printer)) {
        term_print_finish(term);
    }
    if (palette_changed)
        term_notify_palette_changed(term);
    term_schedule_tblink(term);
    term_schedule_cblink(term);
    term_copy_stuff_from_conf(term);
    term_update_raw_mouse_mode(term);
}